

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void helics::apps::fedConnectionList(ConnectionsList *connections,json *fed)

{
  pointer *ppbVar1;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pdVar2;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *puVar3;
  long lVar4;
  char cVar5;
  value_t vVar6;
  iterator iVar7;
  undefined8 uVar8;
  bool bVar9;
  const_iterator cVar10;
  const_reference pvVar11;
  reference pbVar12;
  reference pvVar13;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *this;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar14;
  __hashtable *__h_2;
  __hashtable *__h;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  const_iterator __begin3_7;
  string_view input1;
  const_iterator __begin3;
  string_view endpoint1;
  string_view pub1_2;
  string_view input1_2;
  string_view pubAlias;
  string_view inputAlias;
  string_view eptAlias;
  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_320;
  ConnectionsList *local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_2d8;
  string local_2d0;
  _Rb_tree_node_base *local_2b0;
  TemplateMatcher local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_1f8;
  size_type local_1f0;
  undefined8 uStack_1e8;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  size_type local_40;
  pointer local_38;
  
  if ((fed->m_data).m_type != object) {
    return;
  }
  local_300 = connections;
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[5],void>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       *)(fed->m_data).m_value.object,(char (*) [5])"tags");
  if ((_Rb_tree_header *)cVar10._M_node !=
      &(((fed->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
    pvVar11 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)fed,"tags");
    loadTags(local_300,pvVar11);
  }
  if ((fed->m_data).m_type != object) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[17],void>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       *)(fed->m_data).m_value.object,(char (*) [17])0x3d5f3b);
  local_2d8 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               *)fed;
  if ((_Rb_tree_header *)cVar10._M_node !=
      &(((fed->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header) {
    local_320.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>
                   ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)fed,"connected_inputs");
    local_2a8.templateName._M_string_length = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0;
    local_2a8.templateName.field_2._M_local_buf[6] = '\0';
    local_2a8.templateName.field_2._7_4_ = 0;
    local_2a8.templateName.field_2._12_4_ = 0x80000000;
    cVar5 = *(char *)local_320.m_object;
    if (cVar5 == '\0') {
      local_2a8.templateName.field_2._8_3_ = 1;
LAB_001bae3b:
      local_2a8.templateName.field_2._12_4_ = 0;
      local_2a8.templateName.field_2._7_4_ = (uint)(uint3)local_2a8.templateName.field_2._8_3_ << 8;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = 1;
    }
    else if (cVar5 == '\x02') {
      uVar8 = *(undefined8 *)&(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl
      ;
      local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar8;
      local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
           (undefined2)((ulong)uVar8 >> 0x20);
      local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)uVar8 >> 0x30);
      local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)uVar8 >> 0x38);
      local_2a8.templateName.field_2._8_3_ = 0;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.array_iterator._M_current =
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (cVar5 != '\x01') {
        local_2a8.templateName.field_2._8_3_ = 0;
        goto LAB_001bae3b;
      }
      local_2a8.templateName._M_string_length =
           ((json_value *)((long)local_320.m_object + 8))->binary->m_subtype;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.object_iterator._M_node =
           &(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header._M_header;
    }
    local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
    pdVar2 = &local_300->interfaces;
    puVar3 = &local_300->inputs;
    local_2a8.templateName._M_dataplus._M_p = (pointer)local_320.m_object;
    while (bVar9 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_320), !bVar9) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_2f8,pbVar12);
      pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pdVar2,&local_2f8);
      local_2d0._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
      local_2d0._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,
                        (ulong)(local_2f8.field_2._M_allocated_capacity + 1));
      }
      local_2f8._M_dataplus._M_p = (pointer)puVar3;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)puVar3,&local_2d0,&local_2f8);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar4 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar4;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar4 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar4 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar4 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar4 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar4;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar4 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar4 >> 0x20);
      }
    }
  }
  pbVar14 = local_2d8;
  if (*local_2d8 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[23],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(local_2d8 + 8),(char (*) [23])0x3d5f4e);
  if (cVar10._M_node != (_Base_ptr)(*(long *)(pbVar14 + 8) + 8)) {
    local_320.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(pbVar14,"connected_publications");
    local_2a8.templateName._M_string_length = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0;
    local_2a8.templateName.field_2._M_local_buf[6] = '\0';
    local_2a8.templateName.field_2._7_4_ = 0;
    local_2a8.templateName.field_2._12_4_ = 0x80000000;
    cVar5 = *(char *)local_320.m_object;
    if (cVar5 == '\0') {
      local_2a8.templateName.field_2._8_3_ = 1;
LAB_001bb030:
      local_2a8.templateName.field_2._12_4_ = 0;
      local_2a8.templateName.field_2._7_4_ = (uint)(uint3)local_2a8.templateName.field_2._8_3_ << 8;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = 1;
    }
    else if (cVar5 == '\x02') {
      uVar8 = *(undefined8 *)&(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl
      ;
      local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar8;
      local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
           (undefined2)((ulong)uVar8 >> 0x20);
      local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)uVar8 >> 0x30);
      local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)uVar8 >> 0x38);
      local_2a8.templateName.field_2._8_3_ = 0;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.array_iterator._M_current =
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (cVar5 != '\x01') {
        local_2a8.templateName.field_2._8_3_ = 0;
        goto LAB_001bb030;
      }
      local_2a8.templateName._M_string_length =
           ((json_value *)((long)local_320.m_object + 8))->binary->m_subtype;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.object_iterator._M_node =
           &(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header._M_header;
    }
    local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
    pdVar2 = &local_300->interfaces;
    puVar3 = &local_300->pubs;
    local_2a8.templateName._M_dataplus._M_p = (pointer)local_320.m_object;
    while (bVar9 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_320), pbVar14 = local_2d8, !bVar9) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_2f8,pbVar12);
      pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pdVar2,&local_2f8);
      local_2d0._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
      local_2d0._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,
                        (ulong)(local_2f8.field_2._M_allocated_capacity + 1));
      }
      local_2f8._M_dataplus._M_p = (pointer)puVar3;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)puVar3,&local_2d0,&local_2f8);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar4 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar4;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar4 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar4 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar4 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar4 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar4;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar4 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar4 >> 0x20);
      }
    }
  }
  if (*pbVar14 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[19],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(pbVar14 + 8),(char (*) [19])"unconnected_inputs");
  if (cVar10._M_node != (_Base_ptr)(*(long *)(pbVar14 + 8) + 8)) {
    local_320.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(pbVar14,"unconnected_inputs");
    local_2a8.templateName._M_string_length = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0;
    local_2a8.templateName.field_2._M_local_buf[6] = '\0';
    local_2a8.templateName.field_2._7_4_ = 0;
    local_2a8.templateName.field_2._12_4_ = 0x80000000;
    cVar5 = *(char *)local_320.m_object;
    if (cVar5 == '\0') {
      local_2a8.templateName.field_2._8_3_ = 1;
LAB_001bb225:
      local_2a8.templateName.field_2._12_4_ = 0;
      local_2a8.templateName.field_2._7_4_ = (uint)(uint3)local_2a8.templateName.field_2._8_3_ << 8;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = 1;
    }
    else if (cVar5 == '\x02') {
      uVar8 = *(undefined8 *)&(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl
      ;
      local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar8;
      local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
           (undefined2)((ulong)uVar8 >> 0x20);
      local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)uVar8 >> 0x30);
      local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)uVar8 >> 0x38);
      local_2a8.templateName.field_2._8_3_ = 0;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.array_iterator._M_current =
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (cVar5 != '\x01') {
        local_2a8.templateName.field_2._8_3_ = 0;
        goto LAB_001bb225;
      }
      local_2a8.templateName._M_string_length =
           ((json_value *)((long)local_320.m_object + 8))->binary->m_subtype;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.object_iterator._M_node =
           &(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header._M_header;
    }
    local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
    pdVar2 = &local_300->interfaces;
    local_2b0 = (_Rb_tree_node_base *)&local_300->unconnectedInputs;
    puVar3 = &local_300->inputs;
    local_2a8.templateName._M_dataplus._M_p = (pointer)local_320.m_object;
    while (bVar9 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_320), pbVar14 = local_2d8, !bVar9) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_2f8,pbVar12);
      pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pdVar2,&local_2f8);
      local_2d0._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
      local_2d0._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,
                        (ulong)(local_2f8.field_2._M_allocated_capacity + 1));
      }
      iVar7._M_current =
           (local_300->unconnectedInputs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (local_300->unconnectedInputs).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)local_2b0,iVar7,(basic_string_view<char,_std::char_traits<char>_> *)&local_2d0
                  );
      }
      else {
        *(undefined4 *)&(iVar7._M_current)->_M_len = local_2d0._M_dataplus._M_p._0_4_;
        *(undefined4 *)((long)&(iVar7._M_current)->_M_len + 4) = local_2d0._M_dataplus._M_p._4_4_;
        *(undefined4 *)&(iVar7._M_current)->_M_str = (undefined4)local_2d0._M_string_length;
        *(undefined4 *)((long)&(iVar7._M_current)->_M_str + 4) = local_2d0._M_string_length._4_4_;
        ppbVar1 = &(local_300->unconnectedInputs).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      local_2f8._M_dataplus._M_p = (pointer)puVar3;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)puVar3,&local_2d0,&local_2f8);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar4 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar4;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar4 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar4 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar4 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar4 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar4;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar4 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar4 >> 0x20);
      }
    }
  }
  if (*pbVar14 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[25],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(pbVar14 + 8),(char (*) [25])"unconnected_publications");
  if (cVar10._M_node != (_Base_ptr)(*(long *)(pbVar14 + 8) + 8)) {
    local_320.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(pbVar14,"unconnected_publications");
    local_2a8.templateName._M_string_length = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0;
    local_2a8.templateName.field_2._M_local_buf[6] = '\0';
    local_2a8.templateName.field_2._7_4_ = 0;
    local_2a8.templateName.field_2._12_4_ = 0x80000000;
    cVar5 = *(char *)local_320.m_object;
    if (cVar5 == '\0') {
      local_2a8.templateName.field_2._8_3_ = 1;
LAB_001bb44e:
      local_2a8.templateName.field_2._12_4_ = 0;
      local_2a8.templateName.field_2._7_4_ = (uint)(uint3)local_2a8.templateName.field_2._8_3_ << 8;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = 1;
    }
    else if (cVar5 == '\x02') {
      uVar8 = *(undefined8 *)&(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl
      ;
      local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar8;
      local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
           (undefined2)((ulong)uVar8 >> 0x20);
      local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)uVar8 >> 0x30);
      local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)uVar8 >> 0x38);
      local_2a8.templateName.field_2._8_3_ = 0;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.array_iterator._M_current =
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (cVar5 != '\x01') {
        local_2a8.templateName.field_2._8_3_ = 0;
        goto LAB_001bb44e;
      }
      local_2a8.templateName._M_string_length =
           ((json_value *)((long)local_320.m_object + 8))->binary->m_subtype;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.object_iterator._M_node =
           &(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header._M_header;
    }
    local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
    pdVar2 = &local_300->interfaces;
    local_2b0 = (_Rb_tree_node_base *)&local_300->unconnectedPubs;
    puVar3 = &local_300->pubs;
    local_2a8.templateName._M_dataplus._M_p = (pointer)local_320.m_object;
    while (bVar9 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_320), pbVar14 = local_2d8, !bVar9) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_2f8,pbVar12);
      pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pdVar2,&local_2f8);
      local_2d0._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
      local_2d0._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,
                        (ulong)(local_2f8.field_2._M_allocated_capacity + 1));
      }
      iVar7._M_current =
           (local_300->unconnectedPubs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (local_300->unconnectedPubs).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)local_2b0,iVar7,(basic_string_view<char,_std::char_traits<char>_> *)&local_2d0
                  );
      }
      else {
        *(undefined4 *)&(iVar7._M_current)->_M_len = local_2d0._M_dataplus._M_p._0_4_;
        *(undefined4 *)((long)&(iVar7._M_current)->_M_len + 4) = local_2d0._M_dataplus._M_p._4_4_;
        *(undefined4 *)&(iVar7._M_current)->_M_str = (undefined4)local_2d0._M_string_length;
        *(undefined4 *)((long)&(iVar7._M_current)->_M_str + 4) = local_2d0._M_string_length._4_4_;
        ppbVar1 = &(local_300->unconnectedPubs).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      local_2f8._M_dataplus._M_p = (pointer)puVar3;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)puVar3,&local_2d0,&local_2f8);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar4 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar4;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar4 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar4 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar4 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar4 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar4;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar4 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar4 >> 0x20);
      }
    }
  }
  if (*pbVar14 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[29],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(pbVar14 + 8),(char (*) [29])"unconnected_target_endpoints");
  if (cVar10._M_node != (_Base_ptr)(*(long *)(pbVar14 + 8) + 8)) {
    local_320.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(pbVar14,"unconnected_target_endpoints");
    local_2a8.templateName._M_string_length = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0;
    local_2a8.templateName.field_2._M_local_buf[6] = '\0';
    local_2a8.templateName.field_2._7_4_ = 0;
    local_2a8.templateName.field_2._12_4_ = 0x80000000;
    cVar5 = *(char *)local_320.m_object;
    if (cVar5 == '\0') {
      local_2a8.templateName.field_2._8_3_ = 1;
LAB_001bb677:
      local_2a8.templateName.field_2._12_4_ = 0;
      local_2a8.templateName.field_2._7_4_ = (uint)(uint3)local_2a8.templateName.field_2._8_3_ << 8;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = 1;
    }
    else if (cVar5 == '\x02') {
      uVar8 = *(undefined8 *)&(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl
      ;
      local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar8;
      local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
           (undefined2)((ulong)uVar8 >> 0x20);
      local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)uVar8 >> 0x30);
      local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)uVar8 >> 0x38);
      local_2a8.templateName.field_2._8_3_ = 0;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.array_iterator._M_current =
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (cVar5 != '\x01') {
        local_2a8.templateName.field_2._8_3_ = 0;
        goto LAB_001bb677;
      }
      local_2a8.templateName._M_string_length =
           ((json_value *)((long)local_320.m_object + 8))->binary->m_subtype;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.object_iterator._M_node =
           &(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header._M_header;
    }
    local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
    pdVar2 = &local_300->interfaces;
    local_2b0 = (_Rb_tree_node_base *)&local_300->unconnectedTargetEndpoints;
    puVar3 = &local_300->endpoints;
    local_2a8.templateName._M_dataplus._M_p = (pointer)local_320.m_object;
    while (bVar9 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_320), pbVar14 = local_2d8, !bVar9) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_2f8,pbVar12);
      pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pdVar2,&local_2f8);
      local_2d0._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
      local_2d0._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,
                        (ulong)(local_2f8.field_2._M_allocated_capacity + 1));
      }
      iVar7._M_current =
           (local_300->unconnectedTargetEndpoints).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (local_300->unconnectedTargetEndpoints).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)local_2b0,iVar7,(basic_string_view<char,_std::char_traits<char>_> *)&local_2d0
                  );
      }
      else {
        *(undefined4 *)&(iVar7._M_current)->_M_len = local_2d0._M_dataplus._M_p._0_4_;
        *(undefined4 *)((long)&(iVar7._M_current)->_M_len + 4) = local_2d0._M_dataplus._M_p._4_4_;
        *(undefined4 *)&(iVar7._M_current)->_M_str = (undefined4)local_2d0._M_string_length;
        *(undefined4 *)((long)&(iVar7._M_current)->_M_str + 4) = local_2d0._M_string_length._4_4_;
        ppbVar1 = &(local_300->unconnectedTargetEndpoints).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      local_2f8._M_dataplus._M_p = (pointer)puVar3;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)puVar3,&local_2d0,&local_2f8);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar4 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar4;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar4 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar4 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar4 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar4 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar4;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar4 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar4 >> 0x20);
      }
    }
  }
  if (*pbVar14 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[29],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(pbVar14 + 8),(char (*) [29])"unconnected_source_endpoints");
  if (cVar10._M_node != (_Base_ptr)(*(long *)(pbVar14 + 8) + 8)) {
    local_320.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(pbVar14,"unconnected_source_endpoints");
    local_2a8.templateName._M_string_length = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0;
    local_2a8.templateName.field_2._M_local_buf[6] = '\0';
    local_2a8.templateName.field_2._7_4_ = 0;
    local_2a8.templateName.field_2._12_4_ = 0x80000000;
    cVar5 = *(char *)local_320.m_object;
    if (cVar5 == '\0') {
      local_2a8.templateName.field_2._8_3_ = 1;
LAB_001bb8a0:
      local_2a8.templateName.field_2._12_4_ = 0;
      local_2a8.templateName.field_2._7_4_ = (uint)(uint3)local_2a8.templateName.field_2._8_3_ << 8;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = 1;
    }
    else if (cVar5 == '\x02') {
      uVar8 = *(undefined8 *)&(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl
      ;
      local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar8;
      local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
           (undefined2)((ulong)uVar8 >> 0x20);
      local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)uVar8 >> 0x30);
      local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)uVar8 >> 0x38);
      local_2a8.templateName.field_2._8_3_ = 0;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.array_iterator._M_current =
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (cVar5 != '\x01') {
        local_2a8.templateName.field_2._8_3_ = 0;
        goto LAB_001bb8a0;
      }
      local_2a8.templateName._M_string_length =
           ((json_value *)((long)local_320.m_object + 8))->binary->m_subtype;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.object_iterator._M_node =
           &(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header._M_header;
    }
    local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
    pdVar2 = &local_300->interfaces;
    local_2b0 = (_Rb_tree_node_base *)&local_300->unconnectedSourceEndpoints;
    puVar3 = &local_300->endpoints;
    local_2a8.templateName._M_dataplus._M_p = (pointer)local_320.m_object;
    while (bVar9 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_320), pbVar14 = local_2d8, !bVar9) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_2f8,pbVar12);
      pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pdVar2,&local_2f8);
      local_2d0._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
      local_2d0._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,
                        (ulong)(local_2f8.field_2._M_allocated_capacity + 1));
      }
      iVar7._M_current =
           (local_300->unconnectedSourceEndpoints).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (local_300->unconnectedSourceEndpoints).
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)local_2b0,iVar7,(basic_string_view<char,_std::char_traits<char>_> *)&local_2d0
                  );
      }
      else {
        *(undefined4 *)&(iVar7._M_current)->_M_len = local_2d0._M_dataplus._M_p._0_4_;
        *(undefined4 *)((long)&(iVar7._M_current)->_M_len + 4) = local_2d0._M_dataplus._M_p._4_4_;
        *(undefined4 *)&(iVar7._M_current)->_M_str = (undefined4)local_2d0._M_string_length;
        *(undefined4 *)((long)&(iVar7._M_current)->_M_str + 4) = local_2d0._M_string_length._4_4_;
        ppbVar1 = &(local_300->unconnectedSourceEndpoints).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      local_2f8._M_dataplus._M_p = (pointer)puVar3;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)puVar3,&local_2d0,&local_2f8);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar4 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar4;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar4 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar4 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar4 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar4 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar4;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar4 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar4 >> 0x20);
      }
    }
  }
  if (*pbVar14 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[20],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(pbVar14 + 8),(char (*) [20])"connected_endpoints");
  if (cVar10._M_node != (_Base_ptr)(*(long *)(pbVar14 + 8) + 8)) {
    local_320.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(pbVar14,"connected_endpoints");
    local_2a8.templateName._M_string_length = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0;
    local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0;
    local_2a8.templateName.field_2._M_local_buf[6] = '\0';
    local_2a8.templateName.field_2._7_4_ = 0;
    local_2a8.templateName.field_2._12_4_ = 0x80000000;
    cVar5 = *(char *)local_320.m_object;
    if (cVar5 == '\0') {
      local_2a8.templateName.field_2._8_3_ = 1;
LAB_001bbad5:
      local_2a8.templateName.field_2._12_4_ = 0;
      local_2a8.templateName.field_2._7_4_ = (uint)(uint3)local_2a8.templateName.field_2._8_3_ << 8;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = 1;
    }
    else if (cVar5 == '\x02') {
      uVar8 = *(undefined8 *)&(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl
      ;
      local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)uVar8;
      local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
           (undefined2)((ulong)uVar8 >> 0x20);
      local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)uVar8 >> 0x30);
      local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)uVar8 >> 0x38);
      local_2a8.templateName.field_2._8_3_ = 0;
      local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.array_iterator._M_current =
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (cVar5 != '\x01') {
        local_2a8.templateName.field_2._8_3_ = 0;
        goto LAB_001bbad5;
      }
      local_2a8.templateName._M_string_length =
           ((json_value *)((long)local_320.m_object + 8))->binary->m_subtype;
      local_320.m_it.array_iterator._M_current = (pointer)0x0;
      local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_320.m_it.object_iterator._M_node =
           &(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header._M_header;
    }
    local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
    pdVar2 = &local_300->interfaces;
    puVar3 = &local_300->endpoints;
    local_2a8.templateName._M_dataplus._M_p = (pointer)local_320.m_object;
    while (bVar9 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_2a8,&local_320), pbVar14 = local_2d8, !bVar9) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_2a8);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_2f8,pbVar12);
      pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           pdVar2,&local_2f8);
      local_2d0._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
      local_2d0._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,
                        (ulong)(local_2f8.field_2._M_allocated_capacity + 1));
      }
      local_2f8._M_dataplus._M_p = (pointer)puVar3;
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::basic_string_view<char,std::char_traits<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)puVar3,&local_2d0,&local_2f8);
      if (*local_2a8.templateName._M_dataplus._M_p == '\x02') {
        lVar4 = CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                  CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                           _4_2_,local_2a8.templateName.field_2.
                                                 _M_allocated_capacity._0_4_))) + 0x10;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)lVar4;
        local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
             (undefined2)((ulong)lVar4 >> 0x20);
        local_2a8.templateName.field_2._M_local_buf[6] = (char)((ulong)lVar4 >> 0x30);
        local_2a8.templateName.field_2._M_local_buf[7] = (char)((ulong)lVar4 >> 0x38);
      }
      else if (*local_2a8.templateName._M_dataplus._M_p == '\x01') {
        local_2a8.templateName._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_2a8.templateName._M_string_length);
      }
      else {
        lVar4 = CONCAT44(local_2a8.templateName.field_2._12_4_,
                         CONCAT13(local_2a8.templateName.field_2._M_local_buf[0xb],
                                  local_2a8.templateName.field_2._8_3_)) + 1;
        local_2a8.templateName.field_2._8_3_ = (undefined3)lVar4;
        local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)lVar4 >> 0x18);
        local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)lVar4 >> 0x20);
      }
    }
  }
  if (*pbVar14 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[21],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(pbVar14 + 8),(char (*) [21])"potential_interfaces");
  if (cVar10._M_node == (_Base_ptr)(*(long *)(pbVar14 + 8) + 8)) {
    return;
  }
  local_300->hasPotentialInterfaces = true;
  this = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          *)nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>(pbVar14,"attributes");
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>(this,"name");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_2a8,pvVar11);
  pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_300->federatesWithPotentialInterfaces,&local_2a8.templateName);
  local_2b0 = (_Rb_tree_node_base *)(pvVar13->_M_dataplus)._M_p;
  local_200 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pvVar13->_M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
    operator_delete(local_2a8.templateName._M_dataplus._M_p,
                    CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                             CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                      CONCAT24(local_2a8.templateName.field_2._M_allocated_capacity.
                                               _4_2_,local_2a8.templateName.field_2.
                                                     _M_allocated_capacity._0_4_))) + 1);
  }
  local_1f8 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               *)nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(pbVar14,"potential_interfaces");
  if (*local_1f8 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[7],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(local_1f8 + 8),(char (*) [7])0x3d5da2);
  if (cVar10._M_node != (_Base_ptr)(*(long *)(local_1f8 + 8) + 8)) {
    local_320.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(local_1f8,"inputs");
    local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_320.m_it.array_iterator._M_current = (pointer)0x0;
    local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
    cVar5 = *(char *)local_320.m_object;
    if (cVar5 == '\0') {
      local_320.m_it.primitive_iterator.m_it = 1;
LAB_001bbd81:
      local_2f8._M_string_length = 0;
      local_2f8.field_2._M_allocated_capacity = 0;
      local_2f8.field_2._8_8_ = 1;
    }
    else if (cVar5 == '\x02') {
      local_320.m_it.array_iterator._M_current =
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_2f8._M_string_length = 0;
      local_2f8.field_2._8_8_ = 0x8000000000000000;
      local_2f8.field_2._M_allocated_capacity =
           (size_type)
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (cVar5 != '\x01') {
        local_320.m_it.primitive_iterator.m_it = 0;
        goto LAB_001bbd81;
      }
      local_320.m_it.object_iterator._M_node =
           (_Base_ptr)((json_value *)((long)local_320.m_object + 8))->binary->m_subtype;
      local_2f8.field_2._M_allocated_capacity = 0;
      local_2f8.field_2._8_8_ = 0x8000000000000000;
      local_2f8._M_string_length =
           (size_type)
           &(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header;
    }
    local_2f8._M_dataplus._M_p = (pointer)local_320.m_object;
    bVar9 = nlohmann::json_abi_v3_11_3::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::
            operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                      (&local_320,
                       (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)&local_2f8);
    if (!bVar9) {
      pdVar2 = &local_300->interfaces;
      local_2d8 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)&local_300->potentialInputs;
      do {
        pbVar14 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)nlohmann::json_abi_v3_11_3::detail::
                     iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     ::operator*(&local_320);
        if (*pbVar14 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x3) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_2a8,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)pbVar14);
          pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               pdVar2,&local_2a8.templateName);
          local_2d0._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
          local_2d0._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
            operator_delete(local_2a8.templateName._M_dataplus._M_p,
                            CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                     CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                              CONCAT24(local_2a8.templateName.field_2.
                                                       _M_allocated_capacity._4_2_,
                                                       local_2a8.templateName.field_2.
                                                       _M_allocated_capacity._0_4_))) + 1);
          }
          local_2a8.templateName._M_dataplus._M_p = (pointer)local_200;
          local_2a8.templateName._M_string_length = (size_type)local_2b0;
          local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
               SUB84(local_2d0._M_dataplus._M_p,0);
          local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
               (undefined2)((ulong)local_2d0._M_dataplus._M_p >> 0x20);
          local_2a8.templateName.field_2._M_local_buf[6] =
               (char)((ulong)local_2d0._M_dataplus._M_p >> 0x30);
          local_2a8.templateName.field_2._M_local_buf[7] =
               (char)((ulong)local_2d0._M_dataplus._M_p >> 0x38);
          local_2a8.templateName.field_2._8_3_ = (undefined3)local_2d0._M_string_length;
          local_2a8.templateName.field_2._M_local_buf[0xb] =
               (char)(local_2d0._M_string_length >> 0x18);
          local_2a8.templateName.field_2._12_4_ = (undefined4)(local_2d0._M_string_length >> 0x20);
          local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
          std::
          _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                    ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_2d8,&local_2d0,&local_2a8);
        }
        else if (*pbVar14 ==
                 (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  )0x1) {
          fileops::getName(&local_2d0,(json *)pbVar14);
          if ((pointer)local_2d0._M_string_length != (pointer)0x0) {
            pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string&>
                                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *
                                 )pdVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_2d0);
            local_1c0._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
            local_1c0._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
            local_2a8.templateName._M_dataplus._M_p = (pointer)local_200;
            local_2a8.templateName._M_string_length = (size_type)local_2b0;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                 SUB84(local_1c0._M_dataplus._M_p,0);
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                 (undefined2)((ulong)local_1c0._M_dataplus._M_p >> 0x20);
            local_2a8.templateName.field_2._M_local_buf[6] =
                 (char)((ulong)local_1c0._M_dataplus._M_p >> 0x30);
            local_2a8.templateName.field_2._M_local_buf[7] =
                 (char)((ulong)local_1c0._M_dataplus._M_p >> 0x38);
            local_2a8.templateName.field_2._8_3_ = (undefined3)local_1c0._M_string_length;
            local_2a8.templateName.field_2._M_local_buf[0xb] =
                 (char)(local_1c0._M_string_length >> 0x18);
            local_2a8.templateName.field_2._12_4_ = (undefined4)(local_1c0._M_string_length >> 0x20)
            ;
            local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
            std::
            _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                      ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_2d8,&local_1c0,&local_2a8);
            local_60.field_2._M_allocated_capacity._0_4_ = 0x67726174;
            local_60._M_string_length = 7;
            local_60.field_2._M_allocated_capacity._4_4_ = 0x737465;
            local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
            addPotentialTargets(local_300,(string *)&local_2d0,&local_60,(json *)pbVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,
                              CONCAT44(local_60.field_2._M_allocated_capacity._4_4_,
                                       local_60.field_2._M_allocated_capacity._0_4_) + 1);
            }
            local_2a8.templateName._M_dataplus._M_p = (pointer)&local_2a8.templateName.field_2;
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6563;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
            local_2a8.templateName._M_string_length = 6;
            local_2a8.templateName.field_2._M_local_buf[6] = '\0';
            local_80.field_2._M_allocated_capacity = 0x746163696c627570;
            local_80.field_2._8_4_ = 0x736e6f69;
            local_80._M_string_length = 0xc;
            local_80.field_2._M_local_buf[0xc] = '\0';
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            addPotentialTargetVariations
                      (local_300,(string *)&local_2d0,&local_2a8.templateName,&local_80,
                       (json *)pbVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            local_2a8.templateName._M_dataplus._M_p = (pointer)&local_2a8.templateName.field_2;
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6563;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
            local_2a8.templateName._M_string_length = 6;
            local_2a8.templateName.field_2._M_local_buf[6] = '\0';
            local_a0.field_2._M_allocated_capacity._0_4_ = 0x67726174;
            local_a0._M_string_length = 7;
            local_a0.field_2._M_allocated_capacity._4_4_ = 0x737465;
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            addPotentialTargetVariations
                      (local_300,(string *)&local_2d0,&local_2a8.templateName,&local_a0,
                       (json *)pbVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,
                              CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                                       local_a0.field_2._M_allocated_capacity._0_4_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            if ((*pbVar14 ==
                 (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  )0x1) &&
               (cVar10 = std::
                         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                         ::_M_find_tr<char[6],void>
                                   (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                      **)(pbVar14 + 8),(char (*) [6])"alias"),
               cVar10._M_node != (_Base_ptr)(*(long *)(pbVar14 + 8) + 8))) {
              pvVar11 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>(pbVar14,"alias");
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_2a8,pvVar11);
              pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string>
                                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)pdVar2,&local_2a8.templateName);
              local_180._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
              local_180._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
                operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                  CONCAT24(local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._4_2_,
                                                           local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
              }
              local_2a8.templateName._M_dataplus._M_p = (pointer)local_200;
              local_2a8.templateName._M_string_length = (size_type)local_2b0;
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                   (uint)local_1c0._M_dataplus._M_p;
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                   (undefined2)((ulong)local_1c0._M_dataplus._M_p >> 0x20);
              local_2a8.templateName.field_2._M_local_buf[6] =
                   (char)((ulong)local_1c0._M_dataplus._M_p >> 0x30);
              local_2a8.templateName.field_2._8_3_ = (undefined3)local_1c0._M_string_length;
              local_2a8.templateName.field_2._7_4_ =
                   CONCAT31(local_2a8.templateName.field_2._8_3_,
                            (char)((ulong)local_1c0._M_dataplus._M_p >> 0x38));
              local_2a8.templateName.field_2._M_local_buf[0xb] =
                   (char)(local_1c0._M_string_length >> 0x18);
              local_2a8.templateName.field_2._12_4_ = local_1c0._M_string_length._4_4_;
              local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
              std::
              _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::
              _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                        ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)local_2d8,&local_180,&local_2a8);
              std::
              _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              ::
              _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&>
                        ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                          *)local_300,0,&local_180,&local_1c0);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
        }
        if (*(char *)local_320.m_object == '\x02') {
          local_320.m_it.array_iterator._M_current = local_320.m_it.array_iterator._M_current + 1;
        }
        else if (*(char *)local_320.m_object == '\x01') {
          local_320.m_it.object_iterator._M_node =
               (_Base_ptr)std::_Rb_tree_increment(local_320.m_it.object_iterator._M_node);
        }
        else {
          local_320.m_it.primitive_iterator.m_it = local_320.m_it.primitive_iterator.m_it + 1;
        }
        bVar9 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::
                operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                          (&local_320,
                           (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_2f8);
      } while (!bVar9);
    }
  }
  pbVar14 = local_1f8;
  if (*local_1f8 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[13],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(local_1f8 + 8),(char (*) [13])0x3d5d8b);
  if (cVar10._M_node != (_Base_ptr)(*(long *)(pbVar14 + 8) + 8)) {
    local_320.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(pbVar14,"publications");
    local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_320.m_it.array_iterator._M_current = (pointer)0x0;
    local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
    cVar5 = *(char *)local_320.m_object;
    if (cVar5 == '\0') {
      local_320.m_it.primitive_iterator.m_it = 1;
LAB_001bc377:
      local_2f8._M_string_length = 0;
      local_2f8.field_2._M_allocated_capacity = 0;
      local_2f8.field_2._8_8_ = 1;
    }
    else if (cVar5 == '\x02') {
      local_320.m_it.array_iterator._M_current =
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_2f8._M_string_length = 0;
      local_2f8.field_2._8_8_ = 0x8000000000000000;
      local_2f8.field_2._M_allocated_capacity =
           (size_type)
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (cVar5 != '\x01') {
        local_320.m_it.primitive_iterator.m_it = 0;
        goto LAB_001bc377;
      }
      local_320.m_it.object_iterator._M_node =
           (_Base_ptr)((json_value *)((long)local_320.m_object + 8))->binary->m_subtype;
      local_2f8.field_2._M_allocated_capacity = 0;
      local_2f8.field_2._8_8_ = 0x8000000000000000;
      local_2f8._M_string_length =
           (size_type)
           &(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header;
    }
    local_2f8._M_dataplus._M_p = (pointer)local_320.m_object;
    bVar9 = nlohmann::json_abi_v3_11_3::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::
            operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                      (&local_320,
                       (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)&local_2f8);
    pbVar14 = local_1f8;
    if (!bVar9) {
      pdVar2 = &local_300->interfaces;
      local_2d8 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)&local_300->potentialPubs;
      do {
        pbVar14 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)nlohmann::json_abi_v3_11_3::detail::
                     iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     ::operator*(&local_320);
        if (*pbVar14 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x3) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_2a8,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)pbVar14);
          pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               pdVar2,&local_2a8.templateName);
          local_2d0._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
          local_2d0._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
            operator_delete(local_2a8.templateName._M_dataplus._M_p,
                            CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                     CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                              CONCAT24(local_2a8.templateName.field_2.
                                                       _M_allocated_capacity._4_2_,
                                                       local_2a8.templateName.field_2.
                                                       _M_allocated_capacity._0_4_))) + 1);
          }
          local_2a8.templateName._M_dataplus._M_p = (pointer)local_200;
          local_2a8.templateName._M_string_length = (size_type)local_2b0;
          local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
               SUB84(local_2d0._M_dataplus._M_p,0);
          local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
               (undefined2)((ulong)local_2d0._M_dataplus._M_p >> 0x20);
          local_2a8.templateName.field_2._M_local_buf[6] =
               (char)((ulong)local_2d0._M_dataplus._M_p >> 0x30);
          local_2a8.templateName.field_2._M_local_buf[7] =
               (char)((ulong)local_2d0._M_dataplus._M_p >> 0x38);
          local_2a8.templateName.field_2._8_3_ = (undefined3)local_2d0._M_string_length;
          local_2a8.templateName.field_2._M_local_buf[0xb] =
               (char)(local_2d0._M_string_length >> 0x18);
          local_2a8.templateName.field_2._12_4_ = (undefined4)(local_2d0._M_string_length >> 0x20);
          local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
          std::
          _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                    ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_2d8,&local_2d0,&local_2a8);
        }
        else if (*pbVar14 ==
                 (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  )0x1) {
          fileops::getName(&local_2d0,(json *)pbVar14);
          if ((pointer)local_2d0._M_string_length != (pointer)0x0) {
            pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string&>
                                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *
                                 )pdVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_2d0);
            local_1e0._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
            local_1e0._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
            local_2a8.templateName._M_dataplus._M_p = (pointer)local_200;
            local_2a8.templateName._M_string_length = (size_type)local_2b0;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                 SUB84(local_1e0._M_dataplus._M_p,0);
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                 (undefined2)((ulong)local_1e0._M_dataplus._M_p >> 0x20);
            local_2a8.templateName.field_2._M_local_buf[6] =
                 (char)((ulong)local_1e0._M_dataplus._M_p >> 0x30);
            local_2a8.templateName.field_2._M_local_buf[7] =
                 (char)((ulong)local_1e0._M_dataplus._M_p >> 0x38);
            local_2a8.templateName.field_2._8_3_ = (undefined3)local_1e0._M_string_length;
            local_2a8.templateName.field_2._M_local_buf[0xb] =
                 (char)(local_1e0._M_string_length >> 0x18);
            local_2a8.templateName.field_2._12_4_ = (undefined4)(local_1e0._M_string_length >> 0x20)
            ;
            local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
            std::
            _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                      ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_2d8,&local_1e0,&local_2a8);
            local_1c0.field_2._M_allocated_capacity._0_4_ = 0x67726174;
            local_1c0._M_string_length = 7;
            local_1c0.field_2._M_allocated_capacity._4_4_ = 0x737465;
            local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
            addPotentialTargets(local_300,(string *)&local_2d0,&local_1c0,(json *)pbVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
              operator_delete(local_1c0._M_dataplus._M_p,
                              CONCAT44(local_1c0.field_2._M_allocated_capacity._4_4_,
                                       local_1c0.field_2._M_allocated_capacity._0_4_) + 1);
            }
            local_2a8.templateName._M_dataplus._M_p = (pointer)&local_2a8.templateName.field_2;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x74736564;
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6e69;
            local_2a8.templateName.field_2._M_local_buf[6] = 'a';
            local_2a8.templateName.field_2._7_4_ = 0x6e6f6974;
            local_2a8.templateName._M_string_length = 0xb;
            local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
            local_180.field_2._M_allocated_capacity._4_2_ = 0x7374;
            local_180.field_2._M_allocated_capacity._0_4_ = 0x75706e69;
            local_180._M_string_length = 6;
            local_180.field_2._M_local_buf[6] = '\0';
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
            addPotentialTargetVariations
                      (local_300,(string *)&local_2d0,&local_2a8.templateName,&local_180,
                       (json *)pbVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,
                              CONCAT17(local_180.field_2._M_local_buf[7],
                                       CONCAT16(local_180.field_2._M_local_buf[6],
                                                CONCAT24(local_180.field_2._M_allocated_capacity.
                                                         _4_2_,local_180.field_2.
                                                               _M_allocated_capacity._0_4_))) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            local_2a8.templateName._M_dataplus._M_p = (pointer)&local_2a8.templateName.field_2;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x74736564;
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6e69;
            local_2a8.templateName.field_2._M_local_buf[6] = 'a';
            local_2a8.templateName.field_2._7_4_ = 0x6e6f6974;
            local_2a8.templateName._M_string_length = 0xb;
            local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
            local_c0.field_2._M_allocated_capacity._0_4_ = 0x67726174;
            local_c0._M_string_length = 7;
            local_c0.field_2._M_allocated_capacity._4_4_ = 0x737465;
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            addPotentialTargetVariations
                      (local_300,(string *)&local_2d0,&local_2a8.templateName,&local_c0,
                       (json *)pbVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,
                              CONCAT44(local_c0.field_2._M_allocated_capacity._4_4_,
                                       local_c0.field_2._M_allocated_capacity._0_4_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            if ((*pbVar14 ==
                 (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  )0x1) &&
               (cVar10 = std::
                         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                         ::_M_find_tr<char[6],void>
                                   (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                      **)(pbVar14 + 8),(char (*) [6])"alias"),
               cVar10._M_node != (_Base_ptr)(*(long *)(pbVar14 + 8) + 8))) {
              pvVar11 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>(pbVar14,"alias");
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_2a8,pvVar11);
              pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string>
                                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)pdVar2,&local_2a8.templateName);
              local_1a0._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
              local_1a0._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
                operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                  CONCAT24(local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._4_2_,
                                                           local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
              }
              local_2a8.templateName._M_dataplus._M_p = (pointer)local_200;
              local_2a8.templateName._M_string_length = (size_type)local_2b0;
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
                   (uint)local_1e0._M_dataplus._M_p;
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                   (undefined2)((ulong)local_1e0._M_dataplus._M_p >> 0x20);
              local_2a8.templateName.field_2._M_local_buf[6] =
                   (char)((ulong)local_1e0._M_dataplus._M_p >> 0x30);
              local_2a8.templateName.field_2._8_3_ = (undefined3)local_1e0._M_string_length;
              local_2a8.templateName.field_2._7_4_ =
                   CONCAT31(local_2a8.templateName.field_2._8_3_,
                            (char)((ulong)local_1e0._M_dataplus._M_p >> 0x38));
              local_2a8.templateName.field_2._M_local_buf[0xb] =
                   (char)(local_1e0._M_string_length >> 0x18);
              local_2a8.templateName.field_2._12_4_ = local_1e0._M_string_length._4_4_;
              local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
              std::
              _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::
              _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                        ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)local_2d8,&local_1a0,&local_2a8);
              std::
              _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              ::
              _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&>
                        ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                          *)local_300,0,&local_1a0,&local_1e0);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
        }
        if (*(char *)local_320.m_object == '\x02') {
          local_320.m_it.array_iterator._M_current = local_320.m_it.array_iterator._M_current + 1;
        }
        else if (*(char *)local_320.m_object == '\x01') {
          local_320.m_it.object_iterator._M_node =
               (_Base_ptr)std::_Rb_tree_increment(local_320.m_it.object_iterator._M_node);
        }
        else {
          local_320.m_it.primitive_iterator.m_it = local_320.m_it.primitive_iterator.m_it + 1;
        }
        bVar9 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::
                operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                          (&local_320,
                           (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_2f8);
        pbVar14 = local_1f8;
      } while (!bVar9);
    }
  }
  if (*pbVar14 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[10],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(pbVar14 + 8),(char (*) [10])0x3d5c90);
  if (cVar10._M_node != (_Base_ptr)(*(long *)(pbVar14 + 8) + 8)) {
    local_320.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(pbVar14,"endpoints");
    local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_320.m_it.array_iterator._M_current = (pointer)0x0;
    local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
    cVar5 = *(char *)local_320.m_object;
    if (cVar5 == '\0') {
      local_320.m_it.primitive_iterator.m_it = 1;
LAB_001bc976:
      local_2f8._M_string_length = 0;
      local_2f8.field_2._M_allocated_capacity = 0;
      local_2f8.field_2._8_8_ = 1;
    }
    else if (cVar5 == '\x02') {
      local_320.m_it.array_iterator._M_current =
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_2f8._M_string_length = 0;
      local_2f8.field_2._8_8_ = 0x8000000000000000;
      local_2f8.field_2._M_allocated_capacity =
           (size_type)
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (cVar5 != '\x01') {
        local_320.m_it.primitive_iterator.m_it = 0;
        goto LAB_001bc976;
      }
      local_320.m_it.object_iterator._M_node =
           (_Base_ptr)((json_value *)((long)local_320.m_object + 8))->binary->m_subtype;
      local_2f8.field_2._M_allocated_capacity = 0;
      local_2f8.field_2._8_8_ = 0x8000000000000000;
      local_2f8._M_string_length =
           (size_type)
           &(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header;
    }
    local_2f8._M_dataplus._M_p = (pointer)local_320.m_object;
    bVar9 = nlohmann::json_abi_v3_11_3::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::
            operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                      (&local_320,
                       (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)&local_2f8);
    pbVar14 = local_1f8;
    if (!bVar9) {
      pdVar2 = &local_300->interfaces;
      local_2d8 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)&local_300->potentialEndpoints;
      do {
        pbVar14 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)nlohmann::json_abi_v3_11_3::detail::
                     iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                     ::operator*(&local_320);
        if (*pbVar14 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x1) {
          fileops::getName(&local_2d0,(json *)pbVar14);
          if ((pointer)local_2d0._M_string_length != (pointer)0x0) {
            pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string&>
                                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *
                                 )pdVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_2d0);
            uStack_1e8 = (pvVar13->_M_dataplus)._M_p;
            local_1f0 = pvVar13->_M_string_length;
            local_2a8.templateName._M_dataplus._M_p = (pointer)local_200;
            local_2a8.templateName._M_string_length = (size_type)local_2b0;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (undefined4)local_1f0;
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                 (undefined2)(local_1f0 >> 0x20);
            local_2a8.templateName.field_2._M_local_buf[6] = (char)(local_1f0 >> 0x30);
            local_2a8.templateName.field_2._M_local_buf[7] = (char)(local_1f0 >> 0x38);
            local_2a8.templateName.field_2._8_3_ = SUB83(uStack_1e8,0);
            local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)uStack_1e8 >> 0x18);
            local_2a8.templateName.field_2._12_4_ = (undefined4)((ulong)uStack_1e8 >> 0x20);
            local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
            std::
            _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                      ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_2d8,&local_1f0,&local_2a8);
            local_1e0.field_2._M_allocated_capacity._0_4_ = 0x67726174;
            local_1e0._M_string_length = 7;
            local_1e0.field_2._M_allocated_capacity._4_4_ = 0x737465;
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            addPotentialTargets(local_300,(string *)&local_2d0,&local_1e0,(json *)pbVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,
                              CONCAT44(local_1e0.field_2._M_allocated_capacity._4_4_,
                                       local_1e0.field_2._M_allocated_capacity._0_4_) + 1);
            }
            local_1a0.field_2._8_5_ = 0x736e6f6974;
            local_1a0.field_2._M_allocated_capacity._0_5_ = 0x6373627573;
            local_1a0.field_2._M_allocated_capacity._5_3_ = 0x706972;
            local_1a0._M_string_length = 0xd;
            local_1a0.field_2._M_local_buf[0xd] = '\0';
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            addPotentialTargets(local_300,(string *)&local_2d0,&local_1a0,(json *)pbVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,
                              CONCAT35(local_1a0.field_2._M_allocated_capacity._5_3_,
                                       local_1a0.field_2._M_allocated_capacity._0_5_) + 1);
            }
            local_2a8.templateName._M_dataplus._M_p = (pointer)&local_2a8.templateName.field_2;
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6563;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
            local_2a8.templateName._M_string_length = 6;
            local_2a8.templateName.field_2._M_local_buf[6] = '\0';
            local_e0.field_2._M_allocated_capacity._4_2_ = 0x7374;
            local_e0.field_2._M_allocated_capacity._0_4_ = 0x75706e69;
            local_e0._M_string_length = 6;
            local_e0.field_2._M_local_buf[6] = '\0';
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            addPotentialTargetVariations
                      (local_300,(string *)&local_2d0,&local_2a8.templateName,&local_e0,
                       (json *)pbVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,
                              CONCAT17(local_e0.field_2._M_local_buf[7],
                                       CONCAT16(local_e0.field_2._M_local_buf[6],
                                                CONCAT24(local_e0.field_2._M_allocated_capacity.
                                                         _4_2_,local_e0.field_2.
                                                               _M_allocated_capacity._0_4_))) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            local_2a8.templateName._M_dataplus._M_p = (pointer)&local_2a8.templateName.field_2;
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6563;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
            local_2a8.templateName._M_string_length = 6;
            local_2a8.templateName.field_2._M_local_buf[6] = '\0';
            local_100.field_2._M_allocated_capacity = 0x746e696f70646e65;
            local_100.field_2._M_local_buf[8] = 's';
            local_100._M_string_length = 9;
            local_100.field_2._M_local_buf[9] = '\0';
            local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
            addPotentialTargetVariations
                      (local_300,(string *)&local_2d0,&local_2a8.templateName,&local_100,
                       (json *)pbVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            local_2a8.templateName._M_dataplus._M_p = (pointer)&local_2a8.templateName.field_2;
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6563;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x72756f73;
            local_2a8.templateName._M_string_length = 6;
            local_2a8.templateName.field_2._M_local_buf[6] = '\0';
            local_120.field_2._M_allocated_capacity._0_4_ = 0x67726174;
            local_120._M_string_length = 7;
            local_120.field_2._M_allocated_capacity._4_4_ = 0x737465;
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            addPotentialTargetVariations
                      (local_300,(string *)&local_2d0,&local_2a8.templateName,&local_120,
                       (json *)pbVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,
                              CONCAT44(local_120.field_2._M_allocated_capacity._4_4_,
                                       local_120.field_2._M_allocated_capacity._0_4_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            local_2a8.templateName._M_dataplus._M_p = (pointer)&local_2a8.templateName.field_2;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x74736564;
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6e69;
            local_2a8.templateName.field_2._M_local_buf[6] = 'a';
            local_2a8.templateName.field_2._7_4_ = 0x6e6f6974;
            local_2a8.templateName._M_string_length = 0xb;
            local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
            local_140.field_2._M_allocated_capacity = 0x746e696f70646e65;
            local_140.field_2._M_local_buf[8] = 's';
            local_140._M_string_length = 9;
            local_140.field_2._M_local_buf[9] = '\0';
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            addPotentialTargetVariations
                      (local_300,(string *)&local_2d0,&local_2a8.templateName,&local_140,
                       (json *)pbVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            local_2a8.templateName._M_dataplus._M_p = (pointer)&local_2a8.templateName.field_2;
            local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = 0x74736564;
            local_2a8.templateName.field_2._M_allocated_capacity._4_2_ = 0x6e69;
            local_2a8.templateName.field_2._M_local_buf[6] = 'a';
            local_2a8.templateName.field_2._7_4_ = 0x6e6f6974;
            local_2a8.templateName._M_string_length = 0xb;
            local_2a8.templateName.field_2._M_local_buf[0xb] = '\0';
            local_160.field_2._M_allocated_capacity._0_4_ = 0x67726174;
            local_160._M_string_length = 7;
            local_160.field_2._M_allocated_capacity._4_4_ = 0x737465;
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            addPotentialTargetVariations
                      (local_300,(string *)&local_2d0,&local_2a8.templateName,&local_160,
                       (json *)pbVar14);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,
                              CONCAT44(local_160.field_2._M_allocated_capacity._4_4_,
                                       local_160.field_2._M_allocated_capacity._0_4_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
              operator_delete(local_2a8.templateName._M_dataplus._M_p,
                              CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                       CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                CONCAT24(local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._4_2_,
                                                         local_2a8.templateName.field_2.
                                                         _M_allocated_capacity._0_4_))) + 1);
            }
            if ((*pbVar14 ==
                 (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  )0x1) &&
               (cVar10 = std::
                         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                         ::_M_find_tr<char[6],void>
                                   (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                      **)(pbVar14 + 8),(char (*) [6])"alias"),
               cVar10._M_node != (_Base_ptr)(*(long *)(pbVar14 + 8) + 8))) {
              pvVar11 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>(pbVar14,"alias");
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_2a8,pvVar11);
              pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string>
                                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)pdVar2,&local_2a8.templateName);
              local_38 = (pvVar13->_M_dataplus)._M_p;
              local_40 = pvVar13->_M_string_length;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
                operator_delete(local_2a8.templateName._M_dataplus._M_p,
                                CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                         CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                                  CONCAT24(local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._4_2_,
                                                           local_2a8.templateName.field_2.
                                                           _M_allocated_capacity._0_4_))) + 1);
              }
              local_2a8.templateName._M_dataplus._M_p = (pointer)local_200;
              local_2a8.templateName._M_string_length = (size_type)local_2b0;
              local_2a8.templateName.field_2._M_allocated_capacity._0_4_ = (uint)local_1f0;
              local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
                   (undefined2)(local_1f0 >> 0x20);
              local_2a8.templateName.field_2._M_local_buf[6] = (char)(local_1f0 >> 0x30);
              local_2a8.templateName.field_2._8_3_ = SUB83(uStack_1e8,0);
              local_2a8.templateName.field_2._7_4_ =
                   CONCAT31(local_2a8.templateName.field_2._8_3_,(char)(local_1f0 >> 0x38));
              local_2a8.templateName.field_2._M_local_buf[0xb] = (char)((ulong)uStack_1e8 >> 0x18);
              local_2a8.templateName.field_2._12_4_ = uStack_1e8._4_4_;
              local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
              std::
              _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::
              _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                        ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)local_2d8,&local_40,&local_2a8);
              std::
              _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
              ::
              _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const&>
                        ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                          *)local_300,0,&local_40,&local_1f0);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_2a8,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)pbVar14);
          pvVar13 = std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               pdVar2,&local_2a8.templateName);
          local_2d0._M_string_length = (size_type)(pvVar13->_M_dataplus)._M_p;
          local_2d0._M_dataplus._M_p = (pointer)pvVar13->_M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
            operator_delete(local_2a8.templateName._M_dataplus._M_p,
                            CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                     CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                              CONCAT24(local_2a8.templateName.field_2.
                                                       _M_allocated_capacity._4_2_,
                                                       local_2a8.templateName.field_2.
                                                       _M_allocated_capacity._0_4_))) + 1);
          }
          local_2a8.templateName._M_dataplus._M_p = (pointer)local_200;
          local_2a8.templateName._M_string_length = (size_type)local_2b0;
          local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
               SUB84(local_2d0._M_dataplus._M_p,0);
          local_2a8.templateName.field_2._M_allocated_capacity._4_2_ =
               (undefined2)((ulong)local_2d0._M_dataplus._M_p >> 0x20);
          local_2a8.templateName.field_2._M_local_buf[6] =
               (char)((ulong)local_2d0._M_dataplus._M_p >> 0x30);
          local_2a8.templateName.field_2._M_local_buf[7] =
               (char)((ulong)local_2d0._M_dataplus._M_p >> 0x38);
          local_2a8.templateName.field_2._8_3_ = (undefined3)local_2d0._M_string_length;
          local_2a8.templateName.field_2._M_local_buf[0xb] =
               (char)(local_2d0._M_string_length >> 0x18);
          local_2a8.templateName.field_2._12_4_ = (undefined4)(local_2d0._M_string_length >> 0x20);
          local_2a8.federate._M_len = local_2a8.federate._M_len & 0xffffffffffffff00;
          std::
          _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::basic_string_view<char,std::char_traits<char>>const&,helics::apps::PotentialConnections>
                    ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::apps::PotentialConnections>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_2d8,&local_2d0,&local_2a8);
        }
        if (*(char *)local_320.m_object == '\x02') {
          local_320.m_it.array_iterator._M_current = local_320.m_it.array_iterator._M_current + 1;
        }
        else if (*(char *)local_320.m_object == '\x01') {
          local_320.m_it.object_iterator._M_node =
               (_Base_ptr)std::_Rb_tree_increment(local_320.m_it.object_iterator._M_node);
        }
        else {
          local_320.m_it.primitive_iterator.m_it = local_320.m_it.primitive_iterator.m_it + 1;
        }
        bVar9 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::
                operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                          (&local_320,
                           (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_2f8);
        pbVar14 = local_1f8;
      } while (!bVar9);
    }
  }
  if (*pbVar14 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[22],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(pbVar14 + 8),(char (*) [22])"publication_templates");
  if (cVar10._M_node != (_Base_ptr)(*(long *)(pbVar14 + 8) + 8)) {
    local_320.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(local_1f8,"publication_templates");
    local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_320.m_it.array_iterator._M_current = (pointer)0x0;
    local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
    cVar5 = *(char *)local_320.m_object;
    if (cVar5 == '\0') {
      local_320.m_it.primitive_iterator.m_it = 1;
LAB_001bd264:
      local_2f8._M_string_length = 0;
      local_2f8.field_2._M_allocated_capacity = 0;
      local_2f8.field_2._8_8_ = 1;
    }
    else if (cVar5 == '\x02') {
      local_320.m_it.array_iterator._M_current =
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_2f8._M_string_length = 0;
      local_2f8.field_2._8_8_ = 0x8000000000000000;
      local_2f8.field_2._M_allocated_capacity =
           (size_type)
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (cVar5 != '\x01') {
        local_320.m_it.primitive_iterator.m_it = 0;
        goto LAB_001bd264;
      }
      local_320.m_it.object_iterator._M_node =
           (_Base_ptr)((json_value *)((long)local_320.m_object + 8))->binary->m_subtype;
      local_2f8.field_2._M_allocated_capacity = 0;
      local_2f8.field_2._8_8_ = 0x8000000000000000;
      local_2f8._M_string_length =
           (size_type)
           &(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header;
    }
    local_2f8._M_dataplus._M_p = (pointer)local_320.m_object;
    bVar9 = nlohmann::json_abi_v3_11_3::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::
            operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                      (&local_320,
                       (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)&local_2f8);
    if (!bVar9) {
      local_2d8 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)&local_300->potentialPublicationTemplates;
      do {
        pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::operator*(&local_320);
        if ((pbVar12->m_data).m_type == object) {
          local_2a8.templateName._M_dataplus._M_p = (pointer)&local_2a8.templateName.field_2;
          local_2a8.templateName._M_string_length = 0;
          local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
               local_2a8.templateName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
          local_2a8.keys.
          super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a8.keys.
          super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2a8.intermediaries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2a8.keys.
          super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8.intermediaries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8.intermediaries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a8.usedTemplates.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a8.usedTemplates.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2a8.templatePossibilities.
          super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2a8.usedTemplates.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8.templatePossibilities.
          super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8.templatePossibilities.
          super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a8.federate._M_len = 0;
          local_2a8.federate._M_str = (char *)0x0;
          local_2d0._M_dataplus._M_p = (pointer)0x0;
          __l._M_len = 1;
          __l._M_array = (iterator)&local_2d0;
          CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_2a8.combinations,__l,(allocator_type *)&local_1f0);
          local_2a8.federate._M_len = (size_t)local_200;
          local_2a8.federate._M_str = (char *)local_2b0;
          bVar9 = TemplateMatcher::loadTemplate(&local_2a8,pbVar12);
          if (bVar9) {
            CLI::std::
            vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::
            emplace_back<helics::apps::TemplateMatcher>
                      ((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                        *)local_2d8,&local_2a8);
          }
          if (local_2a8.combinations.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2a8.combinations.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2a8.combinations.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2a8.combinations.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          CLI::std::
          vector<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector(&local_2a8.keys);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2a8.intermediaries);
          CLI::std::
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_2a8.usedTemplates);
          CLI::std::
          vector<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::~vector(&local_2a8.templatePossibilities);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
            operator_delete(local_2a8.templateName._M_dataplus._M_p,
                            CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                     CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                              CONCAT24(local_2a8.templateName.field_2.
                                                       _M_allocated_capacity._4_2_,
                                                       local_2a8.templateName.field_2.
                                                       _M_allocated_capacity._0_4_))) + 1);
          }
        }
        if (*(char *)local_320.m_object == '\x02') {
          local_320.m_it.array_iterator._M_current = local_320.m_it.array_iterator._M_current + 1;
        }
        else if (*(char *)local_320.m_object == '\x01') {
          local_320.m_it.object_iterator._M_node =
               (_Base_ptr)std::_Rb_tree_increment(local_320.m_it.object_iterator._M_node);
        }
        else {
          local_320.m_it.primitive_iterator.m_it = local_320.m_it.primitive_iterator.m_it + 1;
        }
        bVar9 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::
                operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                          (&local_320,
                           (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_2f8);
      } while (!bVar9);
    }
  }
  pbVar14 = local_1f8;
  if (*local_1f8 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[16],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(local_1f8 + 8),(char (*) [16])"input_templates");
  if (cVar10._M_node != (_Base_ptr)(*(long *)(pbVar14 + 8) + 8)) {
    local_320.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(local_1f8,"input_templates");
    local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
    local_320.m_it.array_iterator._M_current = (pointer)0x0;
    local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
    cVar5 = *(char *)local_320.m_object;
    if (cVar5 == '\0') {
      local_320.m_it.primitive_iterator.m_it = 1;
LAB_001bd521:
      local_2f8._M_string_length = 0;
      local_2f8.field_2._M_allocated_capacity = 0;
      local_2f8.field_2._8_8_ = 1;
    }
    else if (cVar5 == '\x02') {
      local_320.m_it.array_iterator._M_current =
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_2f8._M_string_length = 0;
      local_2f8.field_2._8_8_ = 0x8000000000000000;
      local_2f8.field_2._M_allocated_capacity =
           (size_type)
           (((json_value *)((long)local_320.m_object + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (cVar5 != '\x01') {
        local_320.m_it.primitive_iterator.m_it = 0;
        goto LAB_001bd521;
      }
      local_320.m_it.object_iterator._M_node =
           (_Base_ptr)((json_value *)((long)local_320.m_object + 8))->binary->m_subtype;
      local_2f8.field_2._M_allocated_capacity = 0;
      local_2f8.field_2._8_8_ = 0x8000000000000000;
      local_2f8._M_string_length =
           (size_type)
           &(((json_value *)((long)local_320.m_object + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header;
    }
    local_2f8._M_dataplus._M_p = (pointer)local_320.m_object;
    bVar9 = nlohmann::json_abi_v3_11_3::detail::
            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::
            operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                      (&local_320,
                       (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        *)&local_2f8);
    if (!bVar9) {
      local_2d8 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)&local_300->potentialInputTemplates;
      do {
        pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                  iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::operator*(&local_320);
        if ((pbVar12->m_data).m_type == object) {
          local_2a8.templateName._M_dataplus._M_p = (pointer)&local_2a8.templateName.field_2;
          local_2a8.templateName._M_string_length = 0;
          local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
               local_2a8.templateName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
          local_2a8.keys.
          super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a8.keys.
          super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2a8.intermediaries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2a8.keys.
          super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8.intermediaries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8.intermediaries.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a8.usedTemplates.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a8.usedTemplates.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2a8.templatePossibilities.
          super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_2a8.usedTemplates.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8.templatePossibilities.
          super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8.templatePossibilities.
          super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a8.federate._M_len = 0;
          local_2a8.federate._M_str = (char *)0x0;
          local_2d0._M_dataplus._M_p = (pointer)0x0;
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&local_2d0;
          CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_2a8.combinations,__l_00,(allocator_type *)&local_1f0);
          local_2a8.federate._M_len = (size_t)local_200;
          local_2a8.federate._M_str = (char *)local_2b0;
          bVar9 = TemplateMatcher::loadTemplate(&local_2a8,pbVar12);
          if (bVar9) {
            CLI::std::
            vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::
            emplace_back<helics::apps::TemplateMatcher>
                      ((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                        *)local_2d8,&local_2a8);
          }
          if (local_2a8.combinations.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2a8.combinations.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2a8.combinations.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2a8.combinations.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          CLI::std::
          vector<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~vector(&local_2a8.keys);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2a8.intermediaries);
          CLI::std::
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_2a8.usedTemplates);
          CLI::std::
          vector<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::~vector(&local_2a8.templatePossibilities);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
            operator_delete(local_2a8.templateName._M_dataplus._M_p,
                            CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                     CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                              CONCAT24(local_2a8.templateName.field_2.
                                                       _M_allocated_capacity._4_2_,
                                                       local_2a8.templateName.field_2.
                                                       _M_allocated_capacity._0_4_))) + 1);
          }
        }
        if (*(char *)local_320.m_object == '\x02') {
          local_320.m_it.array_iterator._M_current = local_320.m_it.array_iterator._M_current + 1;
        }
        else if (*(char *)local_320.m_object == '\x01') {
          local_320.m_it.object_iterator._M_node =
               (_Base_ptr)std::_Rb_tree_increment(local_320.m_it.object_iterator._M_node);
        }
        else {
          local_320.m_it.primitive_iterator.m_it = local_320.m_it.primitive_iterator.m_it + 1;
        }
        bVar9 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::
                operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                          (&local_320,
                           (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&local_2f8);
      } while (!bVar9);
    }
  }
  pbVar14 = local_1f8;
  if (*local_1f8 !=
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1) {
    return;
  }
  cVar10 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
           ::_M_find_tr<char[19],void>
                     (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                        **)(local_1f8 + 8),(char (*) [19])"endpoint_templates");
  if (cVar10._M_node == (_Base_ptr)(*(long *)(pbVar14 + 8) + 8)) {
    return;
  }
  local_320.m_object =
       nlohmann::json_abi_v3_11_3::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       ::operator[]<char_const>(pbVar14,"endpoint_templates");
  local_320.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
  local_320.m_it.array_iterator._M_current = (pointer)0x0;
  local_320.m_it.primitive_iterator.m_it = -0x8000000000000000;
  vVar6 = ((local_320.m_object)->m_data).m_type;
  if (vVar6 == null) {
    local_320.m_it.primitive_iterator.m_it = 1;
  }
  else {
    if (vVar6 == array) {
      local_320.m_it.array_iterator._M_current =
           ((((local_320.m_object)->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_2f8._M_string_length = 0;
      local_2f8.field_2._8_8_ = 0x8000000000000000;
      local_2f8.field_2._M_allocated_capacity =
           (size_type)
           ((((local_320.m_object)->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_001bd7ec;
    }
    if (vVar6 == object) {
      local_320.m_it.object_iterator._M_node =
           (_Base_ptr)(((local_320.m_object)->m_data).m_value.binary)->m_subtype;
      local_2f8.field_2._M_allocated_capacity = 0;
      local_2f8.field_2._8_8_ = 0x8000000000000000;
      local_2f8._M_string_length =
           (size_type)
           &((((local_320.m_object)->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
      goto LAB_001bd7ec;
    }
    local_320.m_it.primitive_iterator.m_it = 0;
  }
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_allocated_capacity = 0;
  local_2f8.field_2._8_8_ = 1;
LAB_001bd7ec:
  local_2f8._M_dataplus._M_p = (pointer)local_320.m_object;
  bVar9 = nlohmann::json_abi_v3_11_3::detail::
          iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
          ::
          operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                    (&local_320,
                     (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      *)&local_2f8);
  if (!bVar9) {
    local_300 = (ConnectionsList *)&local_300->potentialEndpointTemplates;
    do {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*(&local_320);
      if ((pbVar12->m_data).m_type == object) {
        local_2a8.templateName._M_dataplus._M_p = (pointer)&local_2a8.templateName.field_2;
        local_2a8.templateName._M_string_length = 0;
        local_2a8.templateName.field_2._M_allocated_capacity._0_4_ =
             local_2a8.templateName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        local_2a8.keys.
        super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.keys.
        super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.intermediaries.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.keys.
        super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.intermediaries.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.intermediaries.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.usedTemplates.
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.usedTemplates.
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.templatePossibilities.
        super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2a8.usedTemplates.
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.templatePossibilities.
        super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2a8.templatePossibilities.
        super__Vector_base<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2a8.federate._M_len = 0;
        local_2a8.federate._M_str = (char *)0x0;
        local_2d0._M_dataplus._M_p = (pointer)0x0;
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)&local_2d0;
        CLI::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_2a8.combinations,__l_01,(allocator_type *)&local_1f0);
        local_2a8.federate._M_len = (size_t)local_200;
        local_2a8.federate._M_str = (char *)local_2b0;
        bVar9 = TemplateMatcher::loadTemplate(&local_2a8,pbVar12);
        if (bVar9) {
          CLI::std::
          vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>::
          emplace_back<helics::apps::TemplateMatcher>
                    ((vector<helics::apps::TemplateMatcher,_std::allocator<helics::apps::TemplateMatcher>_>
                      *)local_300,&local_2a8);
        }
        if (local_2a8.combinations.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2a8.combinations.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2a8.combinations.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2a8.combinations.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        CLI::std::
        vector<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~vector(&local_2a8.keys);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2a8.intermediaries);
        CLI::std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_2a8.usedTemplates);
        CLI::std::
        vector<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::~vector(&local_2a8.templatePossibilities);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8.templateName._M_dataplus._M_p != &local_2a8.templateName.field_2) {
          operator_delete(local_2a8.templateName._M_dataplus._M_p,
                          CONCAT17(local_2a8.templateName.field_2._M_local_buf[7],
                                   CONCAT16(local_2a8.templateName.field_2._M_local_buf[6],
                                            CONCAT24(local_2a8.templateName.field_2.
                                                     _M_allocated_capacity._4_2_,
                                                     local_2a8.templateName.field_2.
                                                     _M_allocated_capacity._0_4_))) + 1);
        }
      }
      vVar6 = ((local_320.m_object)->m_data).m_type;
      if (vVar6 == array) {
        local_320.m_it.array_iterator._M_current = local_320.m_it.array_iterator._M_current + 1;
      }
      else if (vVar6 == object) {
        local_320.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_320.m_it.object_iterator._M_node);
      }
      else {
        local_320.m_it.primitive_iterator.m_it = local_320.m_it.primitive_iterator.m_it + 1;
      }
      bVar9 = nlohmann::json_abi_v3_11_3::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::
              operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                        (&local_320,
                         (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)&local_2f8);
    } while (!bVar9);
  }
  return;
}

Assistant:

static void fedConnectionList(ConnectionsList& connections, const nlohmann::json& fed)
{
    try {
        if (fed.contains("tags")) {
            loadTags(connections, fed["tags"]);
        }
        if (fed.contains("connected_inputs")) {
            for (const auto& input : fed["connected_inputs"]) {
                const std::string_view input1 =
                    connections.interfaces.emplace_back(input.get<std::string>());
                connections.inputs.insert(input1);
            }
        }
        if (fed.contains("connected_publications")) {
            for (const auto& pub : fed["connected_publications"]) {
                const std::string_view pub1 =
                    connections.interfaces.emplace_back(pub.get<std::string>());
                connections.pubs.insert(pub1);
            }
        }
        if (fed.contains("unconnected_inputs")) {
            for (const auto& input : fed["unconnected_inputs"]) {
                const std::string_view input1 =
                    connections.interfaces.emplace_back(input.get<std::string>());
                connections.unconnectedInputs.push_back(input1);
                connections.inputs.insert(input1);
            }
        }
        if (fed.contains("unconnected_publications")) {
            for (const auto& pub : fed["unconnected_publications"]) {
                const std::string_view pub1 =
                    connections.interfaces.emplace_back(pub.get<std::string>());
                connections.unconnectedPubs.push_back(pub1);
                connections.pubs.insert(pub1);
            }
        }

        if (fed.contains("unconnected_target_endpoints")) {
            for (const auto& endpoint : fed["unconnected_target_endpoints"]) {
                const std::string_view end1 =
                    connections.interfaces.emplace_back(endpoint.get<std::string>());
                connections.unconnectedTargetEndpoints.push_back(end1);
                connections.endpoints.insert(end1);
            }
        }
        if (fed.contains("unconnected_source_endpoints")) {
            for (const auto& endpoint : fed["unconnected_source_endpoints"]) {
                const std::string_view end1 =
                    connections.interfaces.emplace_back(endpoint.get<std::string>());
                connections.unconnectedSourceEndpoints.push_back(end1);
                connections.endpoints.insert(end1);
            }
        }
        if (fed.contains("connected_endpoints")) {
            for (const auto& endpoint : fed["connected_endpoints"]) {
                const std::string_view end1 =
                    connections.interfaces.emplace_back(endpoint.get<std::string>());
                connections.endpoints.insert(end1);
            }
        }
        if (fed.contains("potential_interfaces")) {
            fedPotentialInterfaceList(connections, fed);
        }
    }
    catch (const nlohmann::json::exception& /*ev*/) {
        // TODO(PT): I think this is going to be almost impossible now, but someday might
        // want to create a response
        return;
    }
}